

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::build_neighborhood(ls_solver *this)

{
  size_type __n;
  bool bVar1;
  allocator_type *__a;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *pvVar2;
  reference pvVar3;
  reference plVar4;
  reference pvVar5;
  long in_RDI;
  lit lc;
  iterator __end3;
  iterator __begin3;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range3;
  lit lv;
  iterator __end2;
  iterator __begin2;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range2;
  variable *vp;
  vector<char,_std::allocator<char>_> neighbor_flag;
  int c;
  size_t v;
  size_t j;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *in_stack_ffffffffffffff28;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *this_00;
  allocator<char> *__n_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_90;
  reference local_88;
  undefined8 local_80;
  size_t local_78;
  lit *local_70;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_68;
  reference local_60;
  reference local_58;
  allocator<char> local_39;
  vector<char,_std::allocator<char>_> local_38;
  int local_1c;
  ulong local_18;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *local_10;
  
  __a = (allocator_type *)(*(long *)(in_RDI + 0x50) + (long)*(int *)(in_RDI + 0x60));
  __n_00 = &local_39;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),(size_type)__n_00,__a);
  std::allocator<char>::~allocator(&local_39);
  local_10 = (vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)0x0;
  while( true ) {
    this_00 = local_10;
    pvVar2 = (vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
             std::vector<char,_std::allocator<char>_>::size(&local_38);
    if (pvVar2 <= this_00) break;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_38,(size_type)local_10);
    *pvVar3 = '\0';
    local_10 = (vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
               ((long)&(local_10->super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>)._M_impl
                       .super__Vector_impl_data._M_start + 1);
  }
  for (local_18 = 1; local_18 <= *(ulong *)(in_RDI + 0x50); local_18 = local_18 + 1) {
    local_60 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,local_18);
    local_58 = local_60;
    local_68._M_current =
         (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin(in_stack_ffffffffffffff28)
    ;
    local_70 = (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end
                                (in_stack_ffffffffffffff28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                          *)this_00,
                         (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      plVar4 = __gnu_cxx::
               __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
               operator*(&local_68);
      local_80 = *(undefined8 *)plVar4;
      local_78 = plVar4->var_num;
      local_1c = (int)local_80 >> 1;
      local_88 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                            (long)local_1c);
      local_90._M_current =
           (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                            (in_stack_ffffffffffffff28);
      std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end(in_stack_ffffffffffffff28);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                            *)this_00,
                           (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                            *)in_stack_ffffffffffffff28);
        if (!bVar1) break;
        plVar4 = __gnu_cxx::
                 __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                 ::operator*(&local_90);
        __n = plVar4->var_num;
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_38,__n);
        if ((*pvVar3 == '\0') && (__n != local_18)) {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_38,__n);
          *pvVar3 = '\x01';
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)this_00,
                     (value_type_conflict1 *)in_stack_ffffffffffffff28);
        }
        __gnu_cxx::
        __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
        operator++(&local_90);
      }
      __gnu_cxx::__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
      ::operator++(&local_68);
    }
    local_10 = (vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)0x0;
    while( true ) {
      in_stack_ffffffffffffff28 = local_10;
      pvVar2 = (vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
               std::vector<int,_std::allocator<int>_>::size(&local_58->neighbor_var_nums);
      if (pvVar2 <= in_stack_ffffffffffffff28) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_58->neighbor_var_nums,(size_type)local_10);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_38,(long)*pvVar5);
      *pvVar3 = '\0';
      local_10 = (vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                 ((long)&(local_10->super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)__a);
  return;
}

Assistant:

void ls_solver::build_neighborhood()
{
    size_t j, v;
    int c;
    vector<char> neighbor_flag(_num_vars + _additional_len);
    for (j = 0; j < neighbor_flag.size(); ++j) {
        neighbor_flag[j] = 0;
    }
    for (v = 1; v <= _num_vars; ++v) {
        variable *vp = &(_vars[v]);
        // vector<lit>& vp2=_vars[v].literals;
        for (lit lv : vp->literals) {
            c = lv.clause_num;
            for (lit lc : _clauses[c].literals) {
                if (!neighbor_flag[lc.var_num] && lc.var_num != v) {
                    neighbor_flag[lc.var_num] = 1;
                    vp->neighbor_var_nums.push_back(lc.var_num);
                }
            }
        }
        for (j = 0; j < vp->neighbor_var_nums.size(); ++j) {
            neighbor_flag[vp->neighbor_var_nums[j]] = 0;
        }
    }
}